

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O1

bool __thiscall cmParseBlanketJSCoverage::JSONParser::ParseFile(JSONParser *this,string *file)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  mapped_type *pmVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint uVar7;
  bool bVar8;
  FileLinesType localCoverageVector;
  string result;
  string filename;
  string line;
  string covResult;
  ifstream in;
  vector<int,_std::allocator<int>_> local_308;
  uint local_2e4;
  string local_2e0;
  key_type local_2c0;
  ulong local_2a0;
  string local_298;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  int local_258;
  undefined4 uStack_254;
  long local_248 [2];
  long local_238 [4];
  uint auStack_218 [122];
  
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in);
  uVar7 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar7 & 5) != 0) {
LAB_001bf8c8:
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                               local_298.field_2._M_local_buf[0]) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,
                      CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                               local_2c0.field_2._M_local_buf[0]) + 1);
    }
    if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (uVar7 & 5) == 0;
  }
  local_2a0 = 0;
  local_2e4 = uVar7;
  do {
    bVar8 = false;
    cVar1 = (char)local_2a0;
    while( true ) {
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_238,&local_298,(bool *)0x0,0xffffffffffffffff);
      if (!bVar2) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](&this->Coverage->TotalCoverage,&local_2c0);
        std::vector<int,_std::allocator<int>_>::operator=(pmVar5,&local_308);
        uVar7 = local_2e4;
        if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        goto LAB_001bf8c8;
      }
      lVar4 = std::__cxx11::string::find((char *)&local_298,0x7ce9de,0);
      if (lVar4 != -1) break;
      lVar4 = std::__cxx11::string::find((char *)&local_298,0x750a11,0);
      if (((lVar4 == -1) || (cVar1 != '\x01')) || (!bVar8)) {
        lVar4 = std::__cxx11::string::find((char *)&local_298,0x7917c3,0);
        if (lVar4 != -1) {
          bVar8 = true;
        }
      }
      else {
        getValue(&local_2e0,this,&local_298,1);
        std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_2e0);
        std::__cxx11::string::operator=((string *)&local_2e0,(string *)&local_258);
        if ((long *)CONCAT44(uStack_254,local_258) != local_248) {
          operator_delete((long *)CONCAT44(uStack_254,local_258),local_248[0] + 1);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_2e0);
        if (iVar3 == 0) {
          local_258 = -1;
          if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = -1;
            goto LAB_001bf79a;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_308,
                     (iterator)
                     local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_258);
        }
        else {
          local_258 = atoi(local_2e0._M_dataplus._M_p);
          if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_308,
                       (iterator)
                       local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_258);
          }
          else {
            *local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_258;
LAB_001bf79a:
            local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((local_2a0 & 1) != 0) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->Coverage->TotalCoverage,&local_2c0);
      std::vector<int,_std::allocator<int>_>::operator=(pmVar5,&local_308);
      if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    getValue(&local_2e0,this,&local_298,0);
    std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_2e0);
    paVar6 = &local_2e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar6) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      paVar6 = extraout_RAX;
    }
    local_2a0 = CONCAT71((int7)((ulong)paVar6 >> 8),1);
  } while( true );
}

Assistant:

bool ParseFile(std::string const& file)
  {
    FileLinesType localCoverageVector;
    std::string filename;
    bool foundFile = false;
    bool inSource = false;
    std::string covResult;
    std::string line;

    cmsys::ifstream in(file.c_str());
    if (!in) {
      return false;
    }
    while (cmSystemTools::GetLineFromStream(in, line)) {
      if (line.find("filename") != std::string::npos) {
        if (foundFile) {
          /*
           * Upon finding a second file name, generate a
           * vector within the total coverage to capture the
           * information in the local vector
           */
          FileLinesType& CoverageVector =
            this->Coverage.TotalCoverage[filename];
          CoverageVector = localCoverageVector;
          localCoverageVector.clear();
        }
        foundFile = true;
        inSource = false;
        filename = this->getValue(line, 0);
      } else if ((line.find("coverage") != std::string::npos) && foundFile &&
                 inSource) {
        /*
         *  two types of "coverage" in the JSON structure
         *
         *  The coverage result over the file or set of files
         *  and the coverage for each individual line
         *
         *  FoundFile and foundSource ensure that
         *  only the value of the line coverage is captured
         */
        std::string result = this->getValue(line, 1);
        result = result.substr(2);
        if (result == "\"\"") {
          // Empty quotation marks indicate that the
          // line is not executable
          localCoverageVector.push_back(-1);
        } else {
          // Else, it contains the number of time executed
          localCoverageVector.push_back(atoi(result.c_str()));
        }
      } else if (line.find("source") != std::string::npos) {
        inSource = true;
      }
    }

    // On exit, capture end of last file covered.
    FileLinesType& CoverageVector = this->Coverage.TotalCoverage[filename];
    CoverageVector = localCoverageVector;
    localCoverageVector.clear();
    return true;
  }